

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_14::XmlReporter::test_case_start_impl(XmlReporter *this,TestCaseData *in)

{
  bool bVar1;
  int iVar2;
  XmlWriter *this_00;
  XmlWriter *__a;
  TestCaseData *in_RSI;
  XmlReporter *in_RDI;
  bool open_ts_tag;
  string *in_stack_fffffffffffffd78;
  XmlWriter *in_stack_fffffffffffffd80;
  undefined1 uVar3;
  string *in_stack_fffffffffffffd88;
  XmlWriter *in_stack_fffffffffffffd90;
  XmlWriter *in_stack_fffffffffffffdb0;
  char *in_stack_fffffffffffffdb8;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  char *in_stack_fffffffffffffe00;
  allocator<char> *attribute;
  string *in_stack_fffffffffffffe08;
  XmlWriter *in_stack_fffffffffffffe10;
  allocator<char> local_1c9;
  string local_1c8 [39];
  undefined1 local_1a1 [41];
  string local_178 [63];
  allocator<char> local_139;
  string local_138 [32];
  uint local_118;
  allocator<char> local_111;
  string local_110 [39];
  allocator<char> local_e9;
  string local_e8 [39];
  allocator<char> local_c1;
  double *in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff48;
  XmlWriter *in_stack_ffffffffffffff50;
  allocator<char> local_99;
  string local_98 [39];
  undefined1 local_71 [57];
  string local_38 [39];
  byte local_11;
  TestCaseData *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  if (in_RDI->tc == (TestCaseData *)0x0) {
    local_11 = 1;
  }
  else {
    iVar2 = strcmp(in_RDI->tc->m_test_suite,in_RSI->m_test_suite);
    if (iVar2 != 0) {
      XmlWriter::endElement(in_stack_fffffffffffffdb0);
      local_11 = 1;
    }
  }
  if ((local_11 & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (allocator<char> *)in_stack_fffffffffffffdb0);
    XmlWriter::startElement(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)(local_71 + 0x38));
    in_stack_fffffffffffffe08 = (string *)&in_RDI->xml;
    in_stack_fffffffffffffe10 = (XmlWriter *)local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
               (allocator<char> *)in_stack_fffffffffffffdb0);
    XmlWriter::writeAttribute
              (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    std::__cxx11::string::~string((string *)(local_71 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_71);
  }
  in_RDI->tc = local_10;
  attribute = &local_99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator<char> *)in_stack_fffffffffffffdb0);
  XmlWriter::startElement(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator<char> *)in_stack_fffffffffffffdb0);
  XmlWriter::writeAttribute(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(char *)attribute);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8,
             (allocator<char> *)in_stack_fffffffffffffdb0);
  String::c_str((String *)0x1214b4);
  skipPathFromFilename((char *)in_stack_fffffffffffffd88);
  this_00 = XmlWriter::writeAttribute
                      (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(char *)attribute);
  __s = &local_111;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,(allocator<char> *)in_stack_fffffffffffffdb0);
  local_118 = line(in_RDI,local_10->m_line);
  __a = XmlWriter::writeAttribute<unsigned_int>
                  (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
                   (uint *)in_stack_ffffffffffffff40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
             (char *)__s,(allocator<char> *)__a);
  XmlWriter::writeAttribute(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,(char *)attribute);
  std::__cxx11::string::~string(local_138);
  std::allocator<char>::~allocator(&local_139);
  std::__cxx11::string::~string(local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string(local_e8);
  std::allocator<char>::~allocator(&local_e9);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator(&local_c1);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  Approx::Approx((Approx *)in_stack_fffffffffffffd80,(double)in_stack_fffffffffffffd78);
  bVar1 = doctest::operator!=((Approx *)in_stack_fffffffffffffd80,(double)in_stack_fffffffffffffd78)
  ;
  uVar3 = (undefined1)((ulong)in_stack_fffffffffffffd80 >> 0x38);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,(allocator<char> *)__a);
    XmlWriter::writeAttribute<double>
              (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_178);
    std::allocator<char>::~allocator((allocator<char> *)(local_1a1 + 0x28));
  }
  if ((local_10->m_may_fail & 1U) != 0) {
    in_stack_fffffffffffffd88 = (string *)&in_RDI->xml;
    in_stack_fffffffffffffd90 = (XmlWriter *)local_1a1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,(allocator<char> *)__a);
    XmlWriter::writeAttribute(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(bool)uVar3);
    std::__cxx11::string::~string((string *)(local_1a1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_1a1);
  }
  if ((local_10->m_should_fail & 1U) != 0) {
    uVar3 = (undefined1)((ulong)&local_1c9 >> 0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
               (char *)__s,(allocator<char> *)__a);
    XmlWriter::writeAttribute(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,(bool)uVar3);
    std::__cxx11::string::~string(local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  return;
}

Assistant:

void test_case_start_impl(const TestCaseData& in) {
            bool open_ts_tag = false;
            if(tc != nullptr) { // we have already opened a test suite
                if(std::strcmp(tc->m_test_suite, in.m_test_suite) != 0) {
                    xml.endElement();
                    open_ts_tag = true;
                }
            }
            else {
                open_ts_tag = true; // first test case ==> first test suite
            }

            if(open_ts_tag) {
                xml.startElement("TestSuite");
                xml.writeAttribute("name", in.m_test_suite);
            }

            tc = &in;
            xml.startElement("TestCase")
                    .writeAttribute("name", in.m_name)
                    .writeAttribute("filename", skipPathFromFilename(in.m_file.c_str()))
                    .writeAttribute("line", line(in.m_line))
                    .writeAttribute("description", in.m_description);

            if(Approx(in.m_timeout) != 0)
                xml.writeAttribute("timeout", in.m_timeout);
            if(in.m_may_fail)
                xml.writeAttribute("may_fail", true);
            if(in.m_should_fail)
                xml.writeAttribute("should_fail", true);
        }